

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O1

ctmbstr prvTidygetNextMutedMessage(TidyDocImpl *doc,TidyIterator *iter)

{
  tidyStrings tVar1;
  char *pcVar2;
  TidyIterator p_Var3;
  TidyIterator p_Var4;
  uint uVar5;
  ulong uVar6;
  
  if (iter == (TidyIterator *)0x0) {
    __assert_fail("iter != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/htacg[P]tidy-html5/src/message.c"
                  ,0x567,"ctmbstr prvTidygetNextMutedMessage(TidyDocImpl *, TidyIterator *)");
  }
  p_Var3 = *iter;
  if (p_Var3 == (TidyIterator)0x0) {
    p_Var3 = (TidyIterator)0x0;
  }
  else if (p_Var3 <= (TidyIterator)(ulong)(doc->muted).count) {
    tVar1 = (doc->muted).list[(long)((long)&p_Var3[-1]._opaque + 3)];
    if (tVar1 == 0x12d) {
      pcVar2 = "TidyDiagnostics";
    }
    else {
      uVar5 = 1;
      do {
        pcVar2 = tidyStringsKeys[uVar5].key;
        if (pcVar2 == (char *)0x0) {
          pcVar2 = "UNDEFINED";
          break;
        }
        uVar6 = (ulong)uVar5;
        uVar5 = uVar5 + 1;
      } while (tidyStringsKeys[uVar6].value != tVar1);
    }
    p_Var3 = (TidyIterator)((long)&p_Var3->_opaque + 1);
    goto LAB_0014e210;
  }
  pcVar2 = (ctmbstr)0x0;
LAB_0014e210:
  p_Var4 = (TidyIterator)0x0;
  if (p_Var3 <= (TidyIterator)(ulong)(doc->muted).count) {
    p_Var4 = p_Var3;
  }
  *iter = p_Var4;
  return pcVar2;
}

Assistant:

ctmbstr TY_(getNextMutedMessage)( TidyDocImpl* doc, TidyIterator* iter )
{
    TidyMutedMessages *list = &(doc->muted);
    size_t index;
    ctmbstr result = NULL;
    assert( iter != NULL );
    index = (size_t)*iter;

    if ( index > 0 && index <= list->count )
    {
        result = TY_(tidyErrorCodeAsKey)(list->list[index-1]);
        index++;
    }
    *iter = (TidyIterator) ( index <= list->count ? index : (size_t)0 );

    return result;
}